

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

optional<pbrt::RGB> __thiscall
pbrt::ParameterDictionary::GetOneRGB(ParameterDictionary *this,string *name)

{
  ParsedParameter *pPVar1;
  __type _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_t sVar4;
  const_reference pvVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  optional<pbrt::RGB> *in_RDI;
  float r;
  float g;
  optional<pbrt::RGB> oVar7;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  RGB *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  fmt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::begin(in_RSI);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
         ::end((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  do {
    if (fmt == args) {
      memset(in_RDI,0,0x10);
      pstd::optional<pbrt::RGB>::optional(in_RDI);
      uVar6 = extraout_RDX_00;
LAB_0074fca0:
      oVar7._8_8_ = uVar6;
      oVar7.optionalValue._0_8_ = in_RDI;
      return oVar7;
    }
    pPVar1 = *(ParsedParameter **)fmt;
    _Var2 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if ((_Var2) &&
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (char *)in_stack_ffffffffffffff98), bVar3)) {
      sVar4 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size
                        (&pPVar1->numbers);
      if (sVar4 < 3) {
        ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RSI,(char *)fmt,args);
      }
      pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                         (&pPVar1->numbers,0);
      r = (float)*pvVar5;
      pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                         (&pPVar1->numbers,1);
      g = (float)*pvVar5;
      pvVar5 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                         (&pPVar1->numbers,2);
      RGB::RGB((RGB *)&stack0xffffffffffffffbc,r,g,(float)*pvVar5);
      pstd::optional<pbrt::RGB>::optional
                ((optional<pbrt::RGB> *)CONCAT44(g,r),in_stack_ffffffffffffff98);
      uVar6 = extraout_RDX;
      goto LAB_0074fca0;
    }
    fmt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &fmt->_M_string_length;
  } while( true );
}

Assistant:

pstd::optional<RGB> ParameterDictionary::GetOneRGB(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->numbers.size() < 3)
                ErrorExit(&p->loc, "Insufficient values for \"rgb\" parameter \"%s\".",
                          p->name);
            return RGB(p->numbers[0], p->numbers[1], p->numbers[2]);
        }
    }
    return {};
}